

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

int alsa_get_max_channel_count(cubeb_conflict1 *ctx,uint32_t *max_channels)

{
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *stream_name;
  snd_pcm_hw_params_t *__s;
  int iVar5;
  long alStack_80 [2];
  uint auStack_70 [2];
  undefined8 auStack_68 [3];
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [4];
  undefined8 local_44;
  cubeb_stream_params params;
  cubeb_stream_conflict1 *stm;
  
  local_44 = 0xac4400000002;
  params.format = CUBEB_SAMPLE_FLOAT32LE;
  uStack_50 = 0x116b65;
  sVar4 = (*cubeb_snd_pcm_hw_params_sizeof)();
  lVar2 = -(sVar4 + 0xf & 0xfffffffffffffff0);
  __s = asStack_48 + lVar2;
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116b7c;
  sVar4 = (*cubeb_snd_pcm_hw_params_sizeof)();
  *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116b89;
  memset(__s,0,sVar4);
  if (ctx == (cubeb_conflict1 *)0x0) {
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116c40;
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x4b3,"int alsa_get_max_channel_count(cubeb *, uint32_t *)");
  }
  *(undefined8 *)((long)auStack_68 + lVar2) = 0;
  *(undefined8 *)((long)auStack_68 + lVar2 + 8) = 0;
  *(undefined8 **)((long)alStack_80 + lVar2 + 8) = &local_44;
  *(undefined8 *)((long)auStack_68 + lVar2 + 0x10) = 0;
  *(undefined4 *)((long)auStack_70 + lVar2) = 100;
  *(undefined8 *)((long)alStack_80 + lVar2) = 0x116bcb;
  iVar3 = alsa_stream_init(ctx,(cubeb_stream_conflict1 **)&params.layout,stream_name,
                           (cubeb_devid)0x0,(cubeb_stream_params *)0x0,(cubeb_devid)0x0,
                           *(cubeb_stream_params **)((long)alStack_80 + lVar2 + 8),
                           *(uint *)((long)auStack_70 + lVar2),
                           *(cubeb_data_callback_conflict1 *)((long)auStack_68 + lVar2),
                           *(cubeb_state_callback_conflict1 *)((long)auStack_68 + lVar2 + 8),
                           *(void **)((long)auStack_68 + lVar2 + 0x10));
  iVar5 = -1;
  if (iVar3 == 0) {
    if (params._12_8_ == 0) {
      *(code **)(asStack_48 + lVar2 + -8) = alsa_get_min_latency;
      __assert_fail("stm",
                    "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                    ,0x4bb,"int alsa_get_max_channel_count(cubeb *, uint32_t *)");
    }
    psVar1 = *(snd_pcm_t **)(params._12_8_ + 0x38);
    *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116c00;
    iVar3 = (*cubeb_snd_pcm_hw_params_any)(psVar1,__s);
    if (-1 < iVar3) {
      *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116c10;
      iVar3 = (*cubeb_snd_pcm_hw_params_get_channels_max)(__s,max_channels);
      if (-1 < iVar3) {
        *(undefined8 *)(asStack_48 + lVar2 + -8) = 0x116c1c;
        alsa_stream_destroy((cubeb_stream_conflict1 *)params._12_8_);
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
alsa_get_max_channel_count(cubeb * ctx, uint32_t * max_channels)
{
  int r;
  cubeb_stream * stm;
  snd_pcm_hw_params_t * hw_params;
  cubeb_stream_params params;
  params.rate = 44100;
  params.format = CUBEB_SAMPLE_FLOAT32NE;
  params.channels = 2;

  snd_pcm_hw_params_alloca(&hw_params);

  assert(ctx);

  r = alsa_stream_init(ctx, &stm, "", NULL, NULL, NULL, &params, 100, NULL,
                       NULL, NULL);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  assert(stm);

  r = WRAP(snd_pcm_hw_params_any)(stm->pcm, hw_params);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_get_channels_max)(hw_params, max_channels);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  alsa_stream_destroy(stm);

  return CUBEB_OK;
}